

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

ExpandMacroResult __thiscall
cmCMakePresetsGraphInternal::BaseMacroExpander::operator()
          (BaseMacroExpander *this,string *macroNamespace,string *macroName,string *macroOut,
          int version)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileOrDir;
  string local_48;
  
  if (macroNamespace->_M_string_length != 0) {
    return Ignore;
  }
  bVar1 = std::operator==(macroName,"sourceDir");
  if (bVar1) {
    std::__cxx11::string::append((string *)macroOut);
    return Ok;
  }
  bVar1 = std::operator==(macroName,"sourceParentDir");
  if (bVar1) {
    cmsys::SystemTools::GetParentDirectory(&local_48,&this->Graph->SourceDir);
    std::__cxx11::string::append((string *)macroOut);
  }
  else {
    bVar1 = std::operator==(macroName,"sourceDirName");
    if (!bVar1) {
      bVar1 = std::operator==(macroName,"dollar");
      if (!bVar1) {
        bVar1 = std::operator==(macroName,"hostSystemName");
        if (bVar1) {
          if (version < 3) {
            return Error;
          }
          local_48._0_16_ = cmSystemTools::GetSystemName();
          std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)macroOut,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_48);
          return Ok;
        }
        bVar1 = std::operator==(macroName,"fileDir");
        if ((bVar1) &&
           ((this->File).
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true)) {
          if (version < 4) {
            return Error;
          }
          fileOrDir = std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value(&this->File);
          cmsys::SystemTools::GetParentDirectory(&local_48,fileOrDir);
          std::__cxx11::string::append((string *)macroOut);
          goto LAB_0021fdd4;
        }
        bVar1 = std::operator==(macroName,"pathListSep");
        if (!bVar1) {
          return Ignore;
        }
        if (version < 5) {
          return Error;
        }
        cmSystemTools::GetSystemPathlistSeparator();
      }
      std::__cxx11::string::push_back((char)macroOut);
      return Ok;
    }
    cmsys::SystemTools::GetFilenameName(&local_48,&this->Graph->SourceDir);
    std::__cxx11::string::append((string *)macroOut);
  }
LAB_0021fdd4:
  std::__cxx11::string::~string((string *)&local_48);
  return Ok;
}

Assistant:

ExpandMacroResult BaseMacroExpander::operator()(
  const std::string& macroNamespace, const std::string& macroName,
  std::string& macroOut, int version) const
{
  if (macroNamespace.empty()) {
    if (macroName == "sourceDir") {
      macroOut += Graph.SourceDir;
      return ExpandMacroResult::Ok;
    }
    if (macroName == "sourceParentDir") {
      macroOut += cmSystemTools::GetParentDirectory(Graph.SourceDir);
      return ExpandMacroResult::Ok;
    }
    if (macroName == "sourceDirName") {
      macroOut += cmSystemTools::GetFilenameName(Graph.SourceDir);
      return ExpandMacroResult::Ok;
    }
    if (macroName == "dollar") {
      macroOut += '$';
      return ExpandMacroResult::Ok;
    }
    if (macroName == "hostSystemName") {
      if (version < 3) {
        return ExpandMacroResult::Error;
      }
      macroOut += cmSystemTools::GetSystemName();
      return ExpandMacroResult::Ok;
    }
    // Enable fileDir macro expansion for non-preset expanders
    if (macroName == "fileDir" && File) {
      if (version < 4) {
        return ExpandMacroResult::Error;
      }
      macroOut += cmSystemTools::GetParentDirectory(File.value());
      return ExpandMacroResult::Ok;
    }
    if (macroName == "pathListSep") {
      if (version < 5) {
        return ExpandMacroResult::Error;
      }
      macroOut += cmSystemTools::GetSystemPathlistSeparator();
      return ExpandMacroResult::Ok;
    }
  }

  return ExpandMacroResult::Ignore;
}